

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locid.cpp
# Opt level: O2

void __thiscall
icu_63::Locale::setUnicodeKeywordValue
          (Locale *this,StringPiece keywordName,StringPiece keywordValue,UErrorCode *status)

{
  char *keywordName_00;
  char *keywordValue_00;
  StringPiece s;
  CharString keywordName_nul;
  CharString keywordValue_nul;
  CharString local_a0;
  CharString local_60;
  
  CharString::CharString(&local_a0,keywordName,status);
  s._8_8_ = keywordValue._8_8_ & 0xffffffff;
  s.ptr_ = keywordValue.ptr_;
  CharString::CharString(&local_60,s,status);
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    keywordName_00 = uloc_toLegacyKey_63(local_a0.buffer.ptr);
    if (keywordName_00 != (char *)0x0) {
      keywordValue_00 = uloc_toLegacyType_63(local_a0.buffer.ptr,local_60.buffer.ptr);
      if (keywordValue_00 != (char *)0x0) {
        setKeywordValue(this,keywordName_00,keywordValue_00,status);
        goto LAB_002802ac;
      }
    }
    *status = U_ILLEGAL_ARGUMENT_ERROR;
  }
LAB_002802ac:
  MaybeStackArray<char,_40>::~MaybeStackArray(&local_60.buffer);
  MaybeStackArray<char,_40>::~MaybeStackArray(&local_a0.buffer);
  return;
}

Assistant:

void
Locale::setUnicodeKeywordValue(StringPiece keywordName,
                               StringPiece keywordValue,
                               UErrorCode& status) {
    // TODO: Remove the need for a const char* to a NUL terminated buffer.
    const CharString keywordName_nul(keywordName, status);
    const CharString keywordValue_nul(keywordValue, status);

    if (U_FAILURE(status)) {
        return;
    }

    const char* legacy_key = uloc_toLegacyKey(keywordName_nul.data());

    if (legacy_key == nullptr) {
        status = U_ILLEGAL_ARGUMENT_ERROR;
        return;
    }

    const char* legacy_value =
        uloc_toLegacyType(keywordName_nul.data(), keywordValue_nul.data());

    if (legacy_value == nullptr) {
        status = U_ILLEGAL_ARGUMENT_ERROR;
        return;
    }

    setKeywordValue(legacy_key, legacy_value, status);
}